

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

int __thiscall
re2::Regexp::Walker<int>::WalkInternal(Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  ushort uVar1;
  deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *pdVar2;
  undefined8 *puVar3;
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *psVar4;
  _Map_pointer ppWVar5;
  WalkState<int> *pWVar6;
  long *plVar7;
  int iVar8;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  WalkState<int> *pWVar10;
  int *piVar11;
  Regexp *pRVar12;
  ulong uVar13;
  _Elt_pointer pWVar14;
  bool stop;
  undefined1 local_1b0 [384];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/walker-inl.h"
               ,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessage::~LogMessage((LogMessage *)local_1b0);
  }
  else {
    pdVar2 = (deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_;
    local_1b0._8_4_ = -1;
    local_1b0._24_8_ = (int *)0x0;
    puVar3 = *(undefined8 **)(pdVar2 + 0x30);
    local_1b0._0_8_ = re;
    local_1b0._12_4_ = top_arg;
    if (puVar3 == (undefined8 *)(*(long *)(pdVar2 + 0x40) + -0x20)) {
      std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
      _M_push_back_aux<re2::WalkState<int>>(pdVar2,(WalkState<int> *)local_1b0);
    }
    else {
      puVar3[2] = local_1b0._16_8_;
      puVar3[3] = 0;
      *puVar3 = re;
      puVar3[1] = CONCAT44(top_arg,0xffffffff);
      *(long *)(pdVar2 + 0x30) = *(long *)(pdVar2 + 0x30) + 0x20;
    }
LAB_001b34d6:
    while( true ) {
      psVar4 = this->stack_;
      pWVar14 = (psVar4->c).
                super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar14 ==
          (psVar4->c).super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar14 = (psVar4->c).
                  super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar12 = pWVar14[-1].re;
      uVar13 = (ulong)(uint)pWVar14[-1].n;
      if (pWVar14[-1].n == 0xffffffff) break;
LAB_001b34fd:
      uVar1 = pRVar12->nsub_;
      if (uVar1 == 0) {
LAB_001b35d9:
        top_arg = (*this->_vptr_Walker[3])
                            (this,pRVar12,(ulong)(uint)pWVar14[-1].parent_arg,
                             (ulong)(uint)pWVar14[-1].pre_arg,pWVar14[-1].child_args);
        if ((1 < pRVar12->nsub_) && (pWVar14[-1].child_args != (int *)0x0)) {
          operator_delete__(pWVar14[-1].child_args);
        }
        goto LAB_001b3623;
      }
      if (uVar1 == 1) {
        paVar9 = &pRVar12->field_5;
      }
      else {
        paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar12->field_5).submany_;
      }
      iVar8 = (int)uVar13;
      if ((int)(uint)uVar1 <= iVar8) goto LAB_001b35d9;
      if (iVar8 < 1 || !use_copy) {
        pRVar12 = (Regexp *)paVar9[iVar8].submany_;
LAB_001b36a9:
        pdVar2 = (deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_;
        local_1b0._12_4_ = pWVar14[-1].pre_arg;
        local_1b0._8_4_ = -1;
        local_1b0._24_8_ = (int *)0x0;
        plVar7 = *(long **)(pdVar2 + 0x30);
        local_1b0._0_8_ = pRVar12;
        if (plVar7 == (long *)(*(long *)(pdVar2 + 0x40) + -0x20)) {
          std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
          _M_push_back_aux<re2::WalkState<int>>(pdVar2,(WalkState<int> *)local_1b0);
        }
        else {
          plVar7[2] = local_1b0._16_8_;
          plVar7[3] = 0;
          *plVar7 = (long)pRVar12;
          plVar7[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
          *(long *)(pdVar2 + 0x30) = *(long *)(pdVar2 + 0x30) + 0x20;
        }
      }
      else {
        pRVar12 = (Regexp *)paVar9[uVar13].submany_;
        if ((Regexp *)paVar9[iVar8 - 1U].submany_ != pRVar12) goto LAB_001b36a9;
        iVar8 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar14[-1].child_args[iVar8 - 1U]);
        pWVar14[-1].child_args[pWVar14[-1].n] = iVar8;
        pWVar14[-1].n = pWVar14[-1].n + 1;
      }
    }
    iVar8 = this->max_visits_;
    this->max_visits_ = iVar8 + -1;
    if (iVar8 < 1) {
      this->stopped_early_ = true;
      top_arg = (*this->_vptr_Walker[5])(this,pRVar12,(ulong)(uint)pWVar14[-1].parent_arg);
    }
    else {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      top_arg = (*this->_vptr_Walker[2])(this,pRVar12,(ulong)(uint)pWVar14[-1].parent_arg,local_1b0)
      ;
      pWVar14[-1].pre_arg = top_arg;
      if (local_1b0[0] == false) {
        pWVar14[-1].n = 0;
        pWVar14[-1].child_args = (int *)0x0;
        uVar1 = pRVar12->nsub_;
        uVar13 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar14[-1].child_args = &pWVar14[-1].child_arg;
            uVar13 = 0;
          }
          else {
            piVar11 = (int *)operator_new__((ulong)uVar1 << 2);
            pWVar14[-1].child_args = piVar11;
            uVar13 = (ulong)(uint)pWVar14[-1].n;
          }
        }
        goto LAB_001b34fd;
      }
    }
LAB_001b3623:
    std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::pop_back
              (&this->stack_->c);
    psVar4 = this->stack_;
    ppWVar5 = (psVar4->c).
              super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    pWVar10 = (psVar4->c).
              super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    pWVar6 = (psVar4->c).
             super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    if (((long)(psVar4->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_start._M_last -
         (long)(psVar4->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_start._M_cur >> 5) +
        ((long)pWVar10 - (long)pWVar6 >> 5) +
        ((((ulong)((long)ppWVar5 -
                  (long)(psVar4->c).
                        super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppWVar5 == (_Map_pointer)0x0)) * 0x10 != 0) {
      if (pWVar10 == pWVar6) {
        pWVar10 = ppWVar5[-1] + 0x10;
      }
      if (pWVar10[-1].child_args == (int *)0x0) {
        piVar11 = &pWVar10[-1].child_arg;
      }
      else {
        piVar11 = pWVar10[-1].child_args + pWVar10[-1].n;
      }
      *piVar11 = top_arg;
      pWVar10[-1].n = pWVar10[-1].n + 1;
      goto LAB_001b34d6;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}